

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcache.h
# Opt level: O0

QList<QString> * __thiscall
QCache<QtFontFallbacksCacheKey,_QList<QString>_>::relink
          (QCache<QtFontFallbacksCacheKey,_QList<QString>_> *this,QtFontFallbacksCacheKey *key)

{
  bool bVar1;
  Node *pNVar2;
  QCache<QtFontFallbacksCacheKey,_QList<QString>_> *in_RDI;
  Node *n;
  Data<QCache<QtFontFallbacksCacheKey,_QList<QString>_>::Node> *in_stack_ffffffffffffffe0;
  QList<QString> *local_8;
  
  bVar1 = isEmpty(in_RDI);
  if (bVar1) {
    local_8 = (QList<QString> *)0x0;
  }
  else {
    pNVar2 = QHashPrivate::Data<QCache<QtFontFallbacksCacheKey,_QList<QString>_>::Node>::
             findNode<QtFontFallbacksCacheKey>
                       (in_stack_ffffffffffffffe0,(QtFontFallbacksCacheKey *)in_RDI);
    if (pNVar2 == (Node *)0x0) {
      local_8 = (QList<QString> *)0x0;
    }
    else {
      if ((Node *)(in_RDI->chain).next != pNVar2) {
        ((pNVar2->super_Chain).prev)->next = (pNVar2->super_Chain).next;
        ((pNVar2->super_Chain).next)->prev = (pNVar2->super_Chain).prev;
        (pNVar2->super_Chain).next = (in_RDI->chain).next;
        ((in_RDI->chain).next)->prev = &pNVar2->super_Chain;
        (pNVar2->super_Chain).prev = &in_RDI->chain;
        (in_RDI->chain).next = &pNVar2->super_Chain;
      }
      local_8 = (pNVar2->value).t;
    }
  }
  return local_8;
}

Assistant:

T *relink(const Key &key) const noexcept
    {
        if (isEmpty())
            return nullptr;
        Node *n = d.findNode(key);
        if (!n)
            return nullptr;

        if (chain.next != n) {
            Q_ASSERT(n->prev);
            Q_ASSERT(n->next);
            n->prev->next = n->next;
            n->next->prev = n->prev;
            n->next = chain.next;
            chain.next->prev = n;
            n->prev = &chain;
            chain.next = n;
        }
        return n->value.t;
    }